

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f pbrt::SampleBilinear(Point2f u,span<const_float> w)

{
  Float FVar1;
  float *pfVar2;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  Float v1;
  Float v0;
  Point2f p;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Tuple2<pbrt::Point2,_float> *this;
  Float b;
  size_t i;
  span<const_float> local_20;
  Tuple2<pbrt::Point2,_float> local_10;
  Tuple2<pbrt::Point2,_float> local_8;
  
  local_10 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  i = 0;
  pstd::span<const_float>::operator[](&local_20,0);
  pstd::span<const_float>::operator[](&local_20,1);
  pstd::span<const_float>::operator[](&local_20,2);
  pstd::span<const_float>::operator[](&local_20,3);
  this = &local_10;
  Tuple2<pbrt::Point2,_float>::operator[](this,1);
  FVar3 = SampleLinear((Float)(i >> 0x20),(Float)i,(Float)((ulong)this >> 0x20));
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,1);
  *pfVar2 = FVar3;
  Tuple2<pbrt::Point2,_float>::operator[](this,0);
  b = (Float)((ulong)this >> 0x20);
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,1);
  FVar3 = *pfVar2;
  pfVar2 = pstd::span<const_float>::operator[](&local_20,i);
  FVar1 = *pfVar2;
  pfVar2 = pstd::span<const_float>::operator[](&local_20,2);
  Lerp(FVar3,FVar1,*pfVar2);
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,1);
  FVar3 = *pfVar2;
  pfVar2 = pstd::span<const_float>::operator[](&local_20,1);
  FVar1 = *pfVar2;
  pfVar2 = pstd::span<const_float>::operator[](&local_20,3);
  Lerp(FVar3,FVar1,*pfVar2);
  FVar3 = SampleLinear((Float)(i >> 0x20),(Float)i,b);
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,0);
  *pfVar2 = FVar3;
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
inline Point2f SampleBilinear(Point2f u, pstd::span<const Float> w) {
    DCHECK_EQ(4, w.size());
    Point2f p;
    // Sample $v$ for bilinear marginal distribution
    Float v0 = w[0] + w[1], v1 = w[2] + w[3];
    p[1] = SampleLinear(u[1], v0, v1);

    // Sample $u$ for bilinear conditional distribution
    p[0] = SampleLinear(u[0], Lerp(p[1], w[0], w[2]), Lerp(p[1], w[1], w[3]));

    return p;
}